

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O1

int get_rect_ind(nhrect *r)

{
  long lVar1;
  
  if (0 < rect_cnt) {
    lVar1 = 0;
    do {
      if ((((r->lx == rect[lVar1].lx) && (r->ly == rect[lVar1].ly)) && (r->hx == rect[lVar1].hx)) &&
         (r->hy == rect[lVar1].hy)) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (rect_cnt != (int)lVar1);
  }
  return -1;
}

Assistant:

int get_rect_ind(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx == rectp->lx && ly == rectp->ly &&
		 hx == rectp->hx && hy == rectp->hy)
		return i;
	return -1;
}